

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

string * __thiscall
glu::sl::ShaderParser::parseShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderParser *this,char *str)

{
  char cVar1;
  bool bVar2;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream o;
  char *local_28;
  char *p;
  char *str_local;
  ShaderParser *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  for (local_28 = str + 2; *local_28 == ' '; local_28 = local_28 + 1) {
  }
  if (*local_28 == '\r') {
    local_28 = local_28 + 1;
  }
  if (*local_28 == '\n') {
    local_28 = local_28 + 1;
  }
  while( true ) {
    bVar2 = true;
    if (*local_28 == '\"') {
      bVar2 = local_28[1] != '\"';
    }
    if (!bVar2) break;
    if (*local_28 == '\\') {
      cVar1 = local_28[1];
      if (cVar1 != '\0') {
        if (cVar1 == 'n') {
          std::operator<<((ostream *)local_1a0,'\n');
        }
        else if (cVar1 == 't') {
          std::operator<<((ostream *)local_1a0,'\t');
        }
        else {
          std::operator<<((ostream *)local_1a0,local_28[1]);
        }
      }
      local_28 = local_28 + 2;
    }
    else {
      std::operator<<((ostream *)local_1a0,*local_28);
      local_28 = local_28 + 1;
    }
  }
  std::__cxx11::ostringstream::str();
  removeExtraIndentation(__return_storage_ptr__,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string ShaderParser::parseShaderSource (const char* str)
{
	const char*		p = str+2;
	ostringstream	o;

	// Eat first empty line from beginning.
	while (*p == ' ') p++;
	if (*p == '\r') p++;
	if (*p == '\n') p++;

	while ((p[0] != '"') || (p[1] != '"'))
	{
		if (*p == '\\')
		{
			switch (p[1])
			{
				case 0:		DE_ASSERT(DE_FALSE);	break;
				case 'n':	o << '\n';				break;
				case 't':	o << '\t';				break;
				default:	o << p[1];				break;
			}

			p += 2;
		}
		else
			o << *p++;
	}

	return removeExtraIndentation(o.str());
}